

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O0

void __thiscall icu_63::CalendarAstronomer::CalendarAstronomer(CalendarAstronomer *this,UDate d)

{
  UDate d_local;
  CalendarAstronomer *this_local;
  
  this->fTime = d;
  this->fLongitude = 0.0;
  this->fLatitude = 0.0;
  this->fGmtOffset = 0.0;
  Equatorial::Equatorial(&this->moonPosition,0.0,0.0);
  this->moonPositionSet = '\0';
  clearCache(this);
  return;
}

Assistant:

CalendarAstronomer::CalendarAstronomer(UDate d): fTime(d), fLongitude(0.0), fLatitude(0.0), fGmtOffset(0.0), moonPosition(0,0), moonPositionSet(FALSE) {
  clearCache();
}